

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * get_dir_path(char *path,char *dist)

{
  char *pcVar1;
  char *in_stack_00000100;
  char *in_stack_00000108;
  
  pcVar1 = get_dir(in_stack_00000108,in_stack_00000100);
  return pcVar1;
}

Assistant:

char *get_dir_path(const char *path, char *dist)
{
#if defined(_WIN32)
	char drive[MAX_PATH];
	if (!get_drive(path, drive))
	{
		return NULL;
	}
	char dir[MAX_PATH];
	if (!get_dir(path, dir))
	{
		return NULL;
	}
	if (strlen(drive) + strlen(dir) + 1 > MAX_PATH)
	{
		return NULL;
	}
	return strcat(strcpy(dist, drive), dir);
#else
	return get_dir(path, dist);
#endif
}